

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtByteDataList
              (void *handle,void *psbt_handle,int kind,uint32_t index,uint32_t *list_num,
              void **data_list_handle)

{
  undefined8 uVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this;
  size_type sVar2;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  undefined4 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> data_list;
  CfdCapiPsbtHandle *psbt_obj;
  CfdCapiPsbtByteDataListHandle *buffer;
  int result;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd70;
  allocator *paVar3;
  allocator local_219;
  string local_218 [36];
  uint32_t in_stack_fffffffffffffe0c;
  string *in_stack_fffffffffffffe10;
  CfdSourceLocation local_1d0;
  string *in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_188;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_170;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_158;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [48];
  void *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  undefined4 *local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_34 = 0xffffffff;
  local_40 = (void *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  if (local_30 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x7b8;
    local_98.funcname = "CfdGetPsbtByteDataList";
    cfd::core::logger::warn<>(&local_98,"data_list_handle is null.");
    local_ba = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Failed to parameter. data_list_handle is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd70,error_code,in_stack_fffffffffffffd60);
    local_ba = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 != (undefined4 *)0x0) {
    if (*(long *)(local_18 + 0x18) != 0) {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_158);
      switch(local_1c) {
      case 5:
        cfd::core::Psbt::GetTxInFinalScript(&local_170,*(Psbt **)(local_80 + 0x18),local_20,true);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60);
        break;
      case 6:
        cfd::core::Psbt::GetTxInRecordKeyList(&local_188,*(Psbt **)(local_80 + 0x18),local_20);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60);
        break;
      case 7:
        cfd::core::Psbt::GetTxOutRecordKeyList
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   &stack0xfffffffffffffe60,*(Psbt **)(local_80 + 0x18),local_20);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60);
        break;
      case 8:
        cfd::core::Psbt::GetGlobalRecordKeyList
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   &stack0xfffffffffffffe48,*(Psbt **)(local_80 + 0x18));
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffd60);
        break;
      default:
        local_1d0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                     ,0x2f);
        local_1d0.filename = local_1d0.filename + 1;
        local_1d0.line = 0x7d9;
        local_1d0.funcname = "CfdGetPsbtByteDataList";
        cfd::core::logger::warn<int&>(&local_1d0,"kind is invalid: {}",&local_1c);
        uVar1 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffe10,"Failed to parameter. kind is invalid.",
                   (allocator *)&stack0xfffffffffffffe0f);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffffd70,error_code,in_stack_fffffffffffffd60);
        __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      paVar3 = &local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"PsbtDataList",paVar3);
      local_40 = cfd::capi::AllocBuffer(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      this = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)operator_new(0x18)
      ;
      (this->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(this);
      *(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> **)((long)local_40 + 0x10)
           = this;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (*(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> **)
                  ((long)local_40 + 0x10),&local_158);
      sVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        (&local_158);
      *local_28 = (int)sVar2;
      *local_30 = local_40;
      local_4 = 0;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this);
      return local_4;
    }
    local_118.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_118.filename = local_118.filename + 1;
    local_118.line = 0x7c4;
    local_118.funcname = "CfdGetPsbtByteDataList";
    cfd::core::logger::warn<>(&local_118,"psbt is null.");
    local_13a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Failed to handle statement. psbt is null.",&local_139);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd70,error_code,in_stack_fffffffffffffd60);
    local_13a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  local_d8.filename = local_d8.filename + 1;
  local_d8.line = 0x7be;
  local_d8.funcname = "CfdGetPsbtByteDataList";
  cfd::core::logger::warn<>(&local_d8,"list_num is null.");
  local_fa = 1;
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Failed to parameter. list_num is null.",&local_f9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffd70,error_code,in_stack_fffffffffffffd60);
  local_fa = 0;
  __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtByteDataList(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    uint32_t* list_num, void** data_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtByteDataListHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (data_list_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "data_list_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. data_list_handle is null.");
    }
    if (list_num == nullptr) {
      warn(CFD_LOG_SOURCE, "list_num is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. list_num is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::vector<ByteData> data_list;
    switch (kind) {
      case kCfdPsbtRecordFinalWitness:
        data_list = psbt_obj->psbt->GetTxInFinalScript(index, true);
        break;
      case kCfdPsbtRecordInputUnknownKeys:
        data_list = psbt_obj->psbt->GetTxInRecordKeyList(index);
        break;
      case kCfdPsbtRecordOutputUnknownKeys:
        data_list = psbt_obj->psbt->GetTxOutRecordKeyList(index);
        break;
      case kCfdPsbtRecordGlobalUnknownKeys:
        data_list = psbt_obj->psbt->GetGlobalRecordKeyList();
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    buffer = static_cast<CfdCapiPsbtByteDataListHandle*>(AllocBuffer(
        kPrefixPsbtByteDataList, sizeof(CfdCapiPsbtByteDataListHandle)));
    buffer->data_list = new std::vector<ByteData>();
    *(buffer->data_list) = data_list;
    *list_num = static_cast<uint32_t>(data_list.size());
    *data_list_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtByteDataList(handle, buffer);
  return result;
}